

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::bind_buffer_range(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  allocator<char> local_6d;
  deUint32 bufU;
  int maxACize;
  deUint32 bufTF;
  string local_60;
  int ssAlignment;
  int maxSSize;
  int uAlignment;
  int maxUSize;
  int maxTFSize;
  deUint32 bufAC;
  
  bufAC = 0x1234;
  bufU = 0x1234;
  bufTF = 0x1234;
  maxTFSize = 0x1234;
  maxUSize = 0x1234;
  uAlignment = 0x1234;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&bufU);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8a11,bufU);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8a11,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&bufTF);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,bufTF);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&bufAC);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x92c0,bufAC);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x92c0,0x10,(void *)0x0,0x88e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER."
             ,(allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8892,0,bufU,0,4);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and index is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS."
             ,(allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8c8b,&maxTFSize);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8c8e,maxTFSize,bufTF,0,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS."
             ,(allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a2f,&maxUSize);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8a11,maxUSize,bufU,0,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if size is less than or equal to zero.",
             (allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8a11,0,bufU,0,-1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8a11,0,bufU,0,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"GL_INVALID_VALUE is generated if offset is less than zero.",
             (allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8a11,0,bufU,-1,0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and size or offset are not multiples of 4."
             ,(allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8c8e,0,bufTF,4,5);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8c8e,0,bufTF,5,4);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x8c8e,0,bufTF,5,7);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and offset is not a multiple of GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT."
             ,(allocator<char> *)&maxACize);
  NegativeTestContext::beginSection(ctx,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a34,&uAlignment);
  glu::CallLogWrapper::glBindBufferRange
            (&ctx->super_CallLogWrapper,0x8a11,0,bufU,(long)(uAlignment + 1),4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    maxACize = 0x1234;
    maxSSize = 0x1234;
    ssAlignment = 0x1234;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and index is greater than or equal to GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS."
               ,&local_6d);
    NegativeTestContext::beginSection(ctx,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x92dc,&maxACize);
    glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x92c0,maxACize,bufU,0,4);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and index is greater than or equal to GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS."
               ,&local_6d);
    NegativeTestContext::beginSection(ctx,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90dd,&maxSSize);
    glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x90d2,maxSSize,bufU,0,4);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,
               "GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and offset is not multiples of 4."
               ,&local_6d);
    NegativeTestContext::beginSection(ctx,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    glu::CallLogWrapper::glBindBufferRange(&ctx->super_CallLogWrapper,0x92c0,0,bufTF,5,4);
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90df,&ssAlignment);
    if (ssAlignment != 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,
                 "GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and offset is not a multiple of the value of GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT."
                 ,&local_6d);
      NegativeTestContext::beginSection(ctx,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      glu::CallLogWrapper::glBindBufferRange
                (&ctx->super_CallLogWrapper,0x90d2,0,bufTF,(long)(ssAlignment + 1),4);
      NegativeTestContext::expectError(ctx,0x501);
      NegativeTestContext::endSection(ctx);
    }
  }
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&bufU);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&bufTF);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&bufAC);
  return;
}

Assistant:

void bind_buffer_range (NegativeTestContext& ctx)
{
	deUint32	bufAC		= 0x1234;
	deUint32	bufU		= 0x1234;
	deUint32	bufTF		= 0x1234;
	int			maxTFSize	= 0x1234;
	int			maxUSize	= 0x1234;
	int			uAlignment	= 0x1234;

	ctx.glGenBuffers(1, &bufU);
	ctx.glBindBuffer(GL_UNIFORM_BUFFER, bufU);
	ctx.glBufferData(GL_UNIFORM_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufTF);
	ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bufTF);
	ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufAC);
	ctx.glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, bufAC);
	ctx.glBufferData(GL_ATOMIC_COUNTER_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER.");
	ctx.glBindBufferRange(GL_ARRAY_BUFFER, 0, bufU, 0, 4);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and index is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &maxTFSize);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, maxTFSize, bufTF, 0, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUSize);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, maxUSize, bufU, 0, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if size is less than or equal to zero.");
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if offset is less than zero.");
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, -1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and size or offset are not multiples of 4.");
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 4, 5);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 5, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 5, 7);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and offset is not a multiple of GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT.");
	ctx.glGetIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &uAlignment);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, uAlignment+1, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		int maxACize	= 0x1234;
		int maxSSize	= 0x1234;
		int ssAlignment	= 0x1234;

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and index is greater than or equal to GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.");
		ctx.glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &maxACize);
		ctx.glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, maxACize, bufU, 0, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and index is greater than or equal to GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS.");
		ctx.glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &maxSSize);
		ctx.glBindBufferRange(GL_SHADER_STORAGE_BUFFER, maxSSize, bufU, 0, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and offset is not multiples of 4.");
		ctx.glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, bufTF, 5, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &ssAlignment);

		if (ssAlignment != 1)
		{
			ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and offset is not a multiple of the value of GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.");
			ctx.glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufTF, ssAlignment+1, 4);
			ctx.expectError(GL_INVALID_VALUE);
			ctx.endSection();
		}
	}

	ctx.glDeleteBuffers(1, &bufU);
	ctx.glDeleteBuffers(1, &bufTF);
	ctx.glDeleteBuffers(1, &bufAC);
}